

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

int __thiscall cmCTestTestHandler::PreProcessHandler(cmCTestTestHandler *this)

{
  cmCTest *this_00;
  int iVar1;
  ostream *this_01;
  char *msg;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestTestHandler *this_local;
  
  iVar1 = ExecuteCommands(this,&this->CustomPreTest);
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    this_01 = std::operator<<((ostream *)local_190,"Problem executing pre-test command(s).");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x183,msg,false);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  this_local._4_4_ = (uint)(iVar1 != 0);
  return this_local._4_4_;
}

Assistant:

int cmCTestTestHandler::PreProcessHandler()
{
  if (!this->ExecuteCommands(this->CustomPreTest)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Problem executing pre-test command(s)." << std::endl);
    return 0;
  }
  return 1;
}